

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

int x509_pubkey_ex_d2i_ex
              (ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt,
              ASN1_TLC *ctx,OSSL_LIB_CTX *libctx,char *propq)

{
  X509_ALGOR *pXVar1;
  ASN1_VALUE *pAVar2;
  int iVar3;
  ASN1_ITEM *it_00;
  char *keytype;
  OSSL_DECODER_CTX *pOVar4;
  OSSL_DECODER_CTX *in_RDX;
  OSSL_LIB_CTX *in_RSI;
  ASN1_VALUE **in_RDI;
  int in_R8D;
  int in_R9D;
  char in_stack_00000008;
  ASN1_TLC *in_stack_00000010;
  size_t slen;
  char txtoidname [50];
  uchar *p;
  uchar *tmpbuf;
  OSSL_DECODER_CTX *dctx;
  int ret;
  X509_PUBKEY *pubkey;
  size_t publen;
  uchar *in_saved;
  char *in_stack_ffffffffffffff28;
  OSSL_LIB_CTX *in_stack_ffffffffffffff30;
  ASN1_TLC *func;
  ASN1_ITEM *in_stack_ffffffffffffff38;
  int iVar5;
  ASN1_VALUE **in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  EVP_PKEY **in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff80;
  undefined1 *local_60;
  int local_4c;
  OSSL_LIB_CTX *pOVar6;
  ASN1_VALUE **ppAVar7;
  
  pXVar1 = (X509_ALGOR *)in_RSI->lock;
  local_60 = (undefined1 *)0x0;
  if ((*in_RDI == (ASN1_VALUE *)0x0) &&
     (iVar3 = x509_pubkey_ex_new_ex
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), iVar3 == 0)) {
    return 0;
  }
  iVar3 = x509_pubkey_ex_populate(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar5 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (iVar3 == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff40,iVar5,(char *)in_stack_ffffffffffffff30);
    ERR_set_error(0xd,0xc0100,(char *)0x0);
    return 0;
  }
  pOVar6 = in_RSI;
  ppAVar7 = in_RDI;
  it_00 = (ASN1_ITEM *)X509_PUBKEY_INTERNAL_it();
  iVar3 = ASN1_item_ex_d2i(in_RDI,(uchar **)in_RSI,(long)in_RDX,it_00,in_R8D,in_R9D,
                           in_stack_00000008,in_stack_00000010);
  if (iVar3 < 1) {
    return iVar3;
  }
  keytype = (char *)((long)pOVar6->lock - (long)pXVar1);
  if (keytype == (char *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RSI,(int)((ulong)in_RDI >> 0x20),&in_stack_00000010->valid);
    ERR_set_error(0xd,0xc0103,(char *)0x0);
    return 0;
  }
  pAVar2 = *ppAVar7;
  EVP_PKEY_free(*(EVP_PKEY **)(pAVar2 + 0x10));
  *(undefined8 *)(pAVar2 + 0x10) = 0;
  ERR_set_mark();
  local_4c = x509_pubkey_decode((EVP_PKEY **)in_RDX,(X509_PUBKEY *)in_RSI);
  if (local_4c == -1) {
    ERR_clear_last_mark();
  }
  else {
    if ((local_4c < 1) && (((byte)pAVar2[0x28] & 1) == 0)) {
      func = in_stack_00000010;
      if (in_R9D != 0) {
        local_60 = (undefined1 *)
                   CRYPTO_memdup(in_RDX,(size_t)in_RSI,(char *)in_RDI,
                                 (int)((ulong)in_stack_00000010 >> 0x20));
        if (local_60 == (undefined1 *)0x0) {
          ERR_new();
          ERR_set_debug((char *)in_RSI,(int)((ulong)in_RDI >> 0x20),&in_stack_00000010->valid);
          ERR_set_error(0xd,0xc0100,(char *)0x0);
          return 0;
        }
        *local_60 = 0x30;
        func = in_stack_00000010;
      }
      iVar3 = OBJ_obj2txt(&stack0xffffffffffffff58,0x32,(ASN1_OBJECT *)**(undefined8 **)pAVar2,0);
      if (iVar3 < 1) {
        ERR_clear_last_mark();
        goto LAB_002e17b4;
      }
      pOVar4 = OSSL_DECODER_CTX_new_for_pkey
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58,keytype,(int)((ulong)in_RDX >> 0x20),in_RSI,
                          in_stack_ffffffffffffff80);
      if (pOVar4 != (OSSL_DECODER_CTX *)0x0) {
        iVar3 = OSSL_DECODER_from_data(in_RDX,(uchar **)in_RSI,(size_t *)in_RDI);
        iVar5 = (int)((ulong)in_RDI >> 0x20);
        if ((iVar3 != 0) && (keytype != (char *)0x0)) {
          ERR_clear_last_mark();
          ERR_new();
          ERR_set_debug((char *)in_RSI,iVar5,&func->valid);
          ERR_set_error(0xd,0x72,(char *)0x0);
          goto LAB_002e17b4;
        }
      }
    }
    ERR_pop_to_mark();
    local_4c = 1;
  }
LAB_002e17b4:
  OSSL_DECODER_CTX_free((OSSL_DECODER_CTX *)0x2e17c1);
  CRYPTO_free(local_60);
  return local_4c;
}

Assistant:

static int x509_pubkey_ex_d2i_ex(ASN1_VALUE **pval,
                                 const unsigned char **in, long len,
                                 const ASN1_ITEM *it, int tag, int aclass,
                                 char opt, ASN1_TLC *ctx, OSSL_LIB_CTX *libctx,
                                 const char *propq)
{
    const unsigned char *in_saved = *in;
    size_t publen;
    X509_PUBKEY *pubkey;
    int ret;
    OSSL_DECODER_CTX *dctx = NULL;
    unsigned char *tmpbuf = NULL;

    if (*pval == NULL && !x509_pubkey_ex_new_ex(pval, it, libctx, propq))
        return 0;
    if (!x509_pubkey_ex_populate(pval, NULL)) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    /* This ensures that |*in| advances properly no matter what */
    if ((ret = ASN1_item_ex_d2i(pval, in, len,
                                ASN1_ITEM_rptr(X509_PUBKEY_INTERNAL),
                                tag, aclass, opt, ctx)) <= 0)
        return ret;

    publen = *in - in_saved;
    if (!ossl_assert(publen > 0)) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_INTERNAL_ERROR);
        return 0;
    }

    pubkey = (X509_PUBKEY *)*pval;
    EVP_PKEY_free(pubkey->pkey);
    pubkey->pkey = NULL;

    /*
     * Opportunistically decode the key but remove any non fatal errors
     * from the queue. Subsequent explicit attempts to decode/use the key
     * will return an appropriate error.
     */
    ERR_set_mark();

    /*
     * Try to decode with legacy method first.  This ensures that engines
     * aren't overriden by providers.
     */
    if ((ret = x509_pubkey_decode(&pubkey->pkey, pubkey)) == -1) {
        /* -1 indicates a fatal error, like malloc failure */
        ERR_clear_last_mark();
        goto end;
    }

    /* Try to decode it into an EVP_PKEY with OSSL_DECODER */
    if (ret <= 0 && !pubkey->flag_force_legacy) {
        const unsigned char *p;
        char txtoidname[OSSL_MAX_NAME_SIZE];
        size_t slen = publen;

        /*
        * The decoders don't know how to handle anything other than Universal
        * class so we modify the data accordingly.
        */
        if (aclass != V_ASN1_UNIVERSAL) {
            tmpbuf = OPENSSL_memdup(in_saved, publen);
            if (tmpbuf == NULL) {
                ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
                return 0;
            }
            in_saved = tmpbuf;
            *tmpbuf = V_ASN1_CONSTRUCTED | V_ASN1_SEQUENCE;
        }
        p = in_saved;

        if (OBJ_obj2txt(txtoidname, sizeof(txtoidname),
                        pubkey->algor->algorithm, 0) <= 0) {
            ERR_clear_last_mark();
            goto end;
        }
        if ((dctx =
             OSSL_DECODER_CTX_new_for_pkey(&pubkey->pkey,
                                           "DER", "SubjectPublicKeyInfo",
                                           txtoidname, EVP_PKEY_PUBLIC_KEY,
                                           pubkey->libctx,
                                           pubkey->propq)) != NULL)
            /*
             * As said higher up, we're being opportunistic.  In other words,
             * we don't care if we fail.
             */
            if (OSSL_DECODER_from_data(dctx, &p, &slen)) {
                if (slen != 0) {
                    /*
                     * If we successfully decoded then we *must* consume all the
                     * bytes.
                     */
                    ERR_clear_last_mark();
                    ERR_raise(ERR_LIB_ASN1, EVP_R_DECODE_ERROR);
                    goto end;
                }
            }
    }

    ERR_pop_to_mark();
    ret = 1;
 end:
    OSSL_DECODER_CTX_free(dctx);
    OPENSSL_free(tmpbuf);
    return ret;
}